

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_13::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,FrameBuffer *outfb,
          vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  undefined8 *puVar1;
  TileProcess TVar2;
  bool bVar3;
  PixelType PVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  pointer pSVar8;
  char cVar9;
  exr_const_context_t p_Var10;
  ushort uVar11;
  int iVar12;
  Slice *pSVar13;
  ulong uVar14;
  ArgExc *this_00;
  float fVar15;
  long lVar16;
  code *pcVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  undefined *puVar22;
  long lVar23;
  pointer pSVar24;
  long lVar25;
  ulong uVar26;
  float *pfVar27;
  float *pfVar28;
  long lVar29;
  int tileY;
  int tileX;
  exr_attr_box2i_t dw;
  int local_70;
  int local_60;
  int local_5c;
  TileProcess *local_58;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *local_50;
  exr_const_context_t local_48;
  int local_40;
  int local_3c;
  
  TVar2 = *this;
  if (TVar2 == (TileProcess)0x1) {
    iVar12 = exr_decoding_initialize();
    if (iVar12 == 0) {
      *this = (TileProcess)0x0;
LAB_001a5e5b:
      iVar12 = exr_get_data_window(ctxt,pn,&local_40);
      if (iVar12 == 0) {
        local_58 = this + 0x48;
        local_50 = filllist;
        local_48 = ctxt;
        iVar12 = exr_get_tile_sizes(ctxt,pn,this[0x1c],this[0x1d],&local_5c,&local_60);
        if (iVar12 == 0) {
          lVar16 = (long)*(int *)(this + 0xc) * (long)local_5c + (long)local_40;
          lVar25 = (long)*(int *)(this + 0x10) * (long)local_60 + (long)local_3c;
          *(undefined8 *)(this + 0xa8) = 0;
          if (0 < *(short *)(this + 0x58)) {
            lVar18 = 0x28;
            lVar29 = 0;
            do {
              lVar5 = *(long *)(this + 0x50);
              pSVar13 = FrameBuffer::findSlice(outfb,*(char **)(lVar5 + -0x28 + lVar18));
              if ((pSVar13 == (Slice *)0x0) || (*(int *)(lVar5 + -0x20 + lVar18) == 0)) {
                puVar1 = (undefined8 *)(lVar5 + -8 + lVar18);
                *puVar1 = 0;
                puVar1[1] = 0;
              }
              else {
                if ((pSVar13->xSampling != 1) || (pSVar13->ySampling != 1)) {
                  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                  goto LAB_001a61d5;
                }
                PVar4 = pSVar13->type;
                lVar20 = lVar16;
                if (pSVar13->xTileCoords != false) {
                  lVar20 = 0;
                }
                bVar3 = pSVar13->yTileCoords;
                *(ushort *)(lVar5 + -0xc + lVar18) = (ushort)(PVar4 != HALF) * 2 + 2;
                *(short *)(lVar5 + -10 + lVar18) = (short)PVar4;
                sVar6 = pSVar13->xStride;
                *(int *)(lVar5 + -8 + lVar18) = (int)sVar6;
                sVar7 = pSVar13->yStride;
                lVar23 = lVar25;
                if (bVar3 != false) {
                  lVar23 = 0;
                }
                *(int *)(lVar5 + -4 + lVar18) = (int)sVar7;
                *(char **)(lVar5 + lVar18) = pSVar13->base + lVar23 * sVar7 + lVar20 * sVar6;
              }
              lVar29 = lVar29 + 1;
              lVar18 = lVar18 + 0x30;
            } while (lVar29 < *(short *)(this + 0x58));
          }
          p_Var10 = local_48;
          if ((TVar2 == (TileProcess)0x0) ||
             (iVar12 = exr_decoding_choose_default_routines(local_48,pn,local_58), iVar12 == 0)) {
            iVar12 = exr_decoding_run(p_Var10,pn,local_58);
            if (iVar12 == 0) {
              pSVar24 = (local_50->
                        super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>)._M_impl
                        .super__Vector_impl_data._M_start;
              pSVar8 = (local_50->
                       super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pSVar24 != pSVar8) {
                local_70 = (int)lVar16;
                do {
                  if ((pSVar24->xSampling != 1) || (pSVar24->ySampling != 1)) {
                    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                    goto LAB_001a61d5;
                  }
                  if (0 < *(int *)(this + 0x14)) {
                    uVar21 = 0;
                    uVar14 = (long)local_70;
                    if (pSVar24->xTileCoords != false) {
                      uVar14 = uVar21;
                    }
                    sVar6 = pSVar24->xStride;
                    sVar7 = pSVar24->yStride;
                    uVar26 = (long)(int)lVar25;
                    if (pSVar24->yTileCoords != false) {
                      uVar26 = uVar21;
                    }
                    pfVar27 = (float *)(pSVar24->base + uVar26 * sVar7 + uVar14 * sVar6);
                    do {
                      if ((int)uVar21 % pSVar24->ySampling == 0) {
                        if (0 < *(int *)(this + 0x18)) {
                          iVar12 = 0;
                          pfVar28 = pfVar27;
                          do {
                            if (iVar12 % pSVar24->xSampling == 0) {
                              PVar4 = pSVar24->type;
                              if (PVar4 == FLOAT) {
                                *pfVar28 = (float)pSVar24->fillValue;
                              }
                              else if (PVar4 == HALF) {
                                fVar15 = ABS((float)pSVar24->fillValue);
                                uVar11 = (ushort)((uint)(float)pSVar24->fillValue >> 0x10) & 0x8000;
                                if ((uint)fVar15 < 0x38800000) {
                                  if ((0x33000000 < (uint)fVar15) &&
                                     (uVar19 = (uint)fVar15 & 0x7fffff | 0x800000,
                                     cVar9 = (char)((uint)fVar15 >> 0x17),
                                     uVar11 = uVar11 | (ushort)(uVar19 >> (0x7eU - cVar9 & 0x1f)),
                                     0x80000000 < uVar19 << (cVar9 + 0xa2U & 0x1f))) {
                                    uVar11 = uVar11 + 1;
                                  }
                                }
                                else if ((uint)fVar15 < 0x7f800000) {
                                  if ((uint)fVar15 < 0x477ff000) {
                                    uVar11 = (ushort)((int)fVar15 + 0x8000fff +
                                                      (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd)
                                             | uVar11;
                                  }
                                  else {
                                    uVar11 = uVar11 | 0x7c00;
                                  }
                                }
                                else {
                                  uVar11 = uVar11 | 0x7c00;
                                  if (fVar15 != INFINITY) {
                                    uVar19 = (uint)fVar15 >> 0xd & 0x3ff;
                                    uVar11 = uVar11 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                                  }
                                }
                                *(ushort *)pfVar28 = uVar11;
                              }
                              else {
                                if (PVar4 != UINT) {
                                  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                                  Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                                  goto LAB_001a61d5;
                                }
                                *pfVar28 = (float)(long)pSVar24->fillValue;
                              }
                              pfVar28 = (float *)((long)pfVar28 + sVar6);
                            }
                            iVar12 = iVar12 + 1;
                          } while (iVar12 < *(int *)(this + 0x18));
                        }
                        pfVar27 = (float *)((long)pfVar27 + sVar7);
                      }
                      uVar19 = (int)uVar21 + 1;
                      uVar21 = (ulong)uVar19;
                    } while ((int)uVar19 < *(int *)(this + 0x14));
                  }
                  pSVar24 = pSVar24 + 1;
                } while (pSVar24 != pSVar8);
              }
              return;
            }
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to run decoder");
          }
          else {
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to choose decoder routines");
          }
          goto LAB_001a62dc;
        }
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
LAB_001a61d5:
      puVar22 = &Iex_3_4::ArgExc::typeinfo;
      pcVar17 = Iex_3_4::ArgExc::~ArgExc;
      goto LAB_001a61e3;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to initialize decode pipeline");
  }
  else {
    iVar12 = exr_decoding_update(ctxt,pn,this + 8,this + 0x48);
    if (iVar12 == 0) goto LAB_001a5e5b;
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to update decode pipeline");
  }
LAB_001a62dc:
  puVar22 = &Iex_3_4::IoExc::typeinfo;
  pcVar17 = Iex_3_4::IoExc::~IoExc;
LAB_001a61e3:
  __cxa_throw(this_00,puVar22,pcVar17);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const FrameBuffer *outfb,
    const std::vector<Slice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;

    // stash the flag off to make sure to clean up in the event
    // of an exception by changing the flag after init...
    bool isfirst = first;
    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (isfirst)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    if (EXR_ERR_SUCCESS != exr_decoding_run (ctxt, pn, &decoder))
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}